

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

const_iterator __thiscall
ghc::filesystem::path::iterator::increment(iterator *this,const_iterator *pos)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  char *pcVar7;
  
  pcVar2 = pos->_M_current;
  pcVar3 = (this->_last)._M_current;
  if (pcVar3 == pcVar2) {
    return (const_iterator)pcVar2;
  }
  pcVar4 = (this->_first)._M_current;
  pcVar1 = pcVar2 + 1;
  if (*pcVar2 == '/') {
    if (pcVar1 == pcVar3) {
      return (const_iterator)pcVar1;
    }
    if (*pcVar1 != '/') {
      return (const_iterator)pcVar1;
    }
    pcVar5 = pcVar1;
    if ((pcVar4 != pcVar2) || ((pcVar7 = pcVar2 + 2, pcVar7 != pcVar3 && (*pcVar7 == '/')))) {
      while( true ) {
        if (pcVar5 == pcVar3) {
          return (const_iterator)pcVar1;
        }
        if (*pcVar5 != '/') break;
        pcVar1 = pcVar3;
        pcVar5 = pcVar5 + 1;
      }
      return (const_iterator)pcVar5;
    }
  }
  else {
    pcVar7 = pcVar1;
    if ((pcVar1 != pcVar3 && pcVar4 == pcVar2) && (*pcVar1 == ':')) {
      return (const_iterator)(pcVar2 + 2);
    }
  }
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (pcVar7);
  return (const_iterator)_Var6._M_current;
}

Assistant:

GHC_INLINE path::impl_string_type::const_iterator path::iterator::increment(const path::impl_string_type::const_iterator& pos) const
{
    path::impl_string_type::const_iterator i = pos;
    bool fromStart = i == _first;
    if (i != _last) {
        // we can only sit on a slash if it is a network name or a root
        if (*i++ == '/') {
            if (i != _last && *i == '/') {
                if (fromStart && !(i + 1 != _last && *(i + 1) == '/')) {
                    // leadind double slashes detected, treat this and the
                    // following until a slash as one unit
                    i = std::find(++i, _last, '/');
                }
                else {
                    // skip redundant slashes
                    while (i != _last && *i == '/') {
                        ++i;
                    }
                }
            }
        }
        else {
            if (fromStart && i != _last && *i == ':') {
                ++i;
            }
            else {
                i = std::find(i, _last, '/');
            }
        }
    }
    return i;
}